

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O2

void __thiscall
Bezier<3,_2>::set(Bezier<3,_2> *this,initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list)

{
  long lVar1;
  long i;
  Matrix<double,_2,_1,_0,_2,_1> *it;
  iterator src;
  Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> local_60;
  
  src = list->_M_array;
  i = 0;
  for (lVar1 = list->_M_len << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
              (&local_60,this->derivative_precal_points_,i);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>,Eigen::Matrix<double,2,1,0,2,1>>
              (&local_60,src);
    if (i == 3) break;
    i = i + 1;
    src = src + 1;
  }
  (**(this->super_Curve<3,_2>)._vptr_Curve)(this);
  return;
}

Assistant:

void set(const std::initializer_list<PointType>& list) {
    int i = 0;
    for (const auto& it : list) {
      derivative_precal_points_[0].col(i) = it;
      if (++i > N) {
        break;
      }
    }
    computeLength();
  }